

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O2

void __thiscall soul::HEARTGenerator::visit(HEARTGenerator *this,StructMemberRef *a)

{
  Expression *parent;
  Variable *dest;
  StructElement *source;
  Type structType;
  string sStack_58;
  Type local_38;
  
  getStructType(&local_38,this,a);
  parent = evaluateAsExpression(this,(a->object).object,&local_38);
  if ((this->currentTargetVariable).object != (Variable *)0x0) {
    dest = pool_ptr<soul::heart::Variable>::operator*(&this->currentTargetVariable);
    std::__cxx11::string::string((string *)&sStack_58,(string *)&a->memberName);
    source = BlockBuilder::createStructElement
                       (&(this->builder).super_BlockBuilder,parent,&sStack_58);
    BlockBuilder::addCastOrAssignment
              (&(this->builder).super_BlockBuilder,&dest->super_Expression,&source->super_Expression
              );
    std::__cxx11::string::~string((string *)&sStack_58);
  }
  RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_38.structure);
  return;
}

Assistant:

void visit (AST::StructMemberRef& a) override
    {
        auto structType = getStructType (a);
        auto& source = evaluateAsExpression (a.object, structType);

        if (currentTargetVariable != nullptr)
            builder.addCastOrAssignment (*currentTargetVariable, builder.createStructElement (source, a.memberName));
    }